

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::LaunchRequest>::destruct(BasicTypeInfo<dap::LaunchRequest> *this,void *ptr)

{
  if (*ptr != 0) {
    (**(code **)(**(long **)((long)ptr + 8) + 0x38))();
    if (*ptr == 0) {
      __assert_fail("value != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xc3,"void dap::any::free()");
    }
    if (*(void **)((long)ptr + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)((long)ptr + 0x10));
      *(undefined8 *)((long)ptr + 0x10) = 0;
    }
  }
  *(undefined8 *)ptr = 0;
  *(undefined8 *)((long)ptr + 8) = 0;
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }